

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

ON_BoundingBox * __thiscall
ON_RTree::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_RTree *this)

{
  double dVar1;
  int iVar2;
  ON_RTreeNode *pOVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  pOVar3 = this->m_root;
  if ((pOVar3 != (ON_RTreeNode *)0x0) && (0 < pOVar3->m_count)) {
    ON_3dPoint::operator=(&__return_storage_ptr__->m_min,(double *)pOVar3->m_branch);
    ON_3dPoint::operator=(&__return_storage_ptr__->m_max,this->m_root->m_branch[0].m_rect.m_max);
    pOVar3 = this->m_root;
    iVar2 = pOVar3->m_count;
    if (1 < (long)iVar2) {
      dVar5 = (__return_storage_ptr__->m_max).x;
      dVar6 = (__return_storage_ptr__->m_min).x;
      dVar7 = (__return_storage_ptr__->m_min).y;
      dVar8 = (__return_storage_ptr__->m_min).z;
      dVar9 = (__return_storage_ptr__->m_max).y;
      dVar10 = (__return_storage_ptr__->m_max).z;
      lVar4 = 0;
      do {
        dVar1 = *(double *)((long)pOVar3->m_branch[1].m_rect.m_min + lVar4);
        if (dVar1 < dVar6) {
          (__return_storage_ptr__->m_min).x = dVar1;
          dVar6 = dVar1;
        }
        dVar1 = *(double *)((long)pOVar3->m_branch[1].m_rect.m_min + lVar4 + 8);
        if (dVar1 < dVar7) {
          (__return_storage_ptr__->m_min).y = dVar1;
          dVar7 = dVar1;
        }
        dVar1 = *(double *)((long)pOVar3->m_branch[1].m_rect.m_min + lVar4 + 0x10);
        if (dVar1 < dVar8) {
          (__return_storage_ptr__->m_min).z = dVar1;
          dVar8 = dVar1;
        }
        dVar1 = *(double *)((long)pOVar3->m_branch[1].m_rect.m_max + lVar4);
        if (dVar5 < dVar1) {
          (__return_storage_ptr__->m_max).x = dVar1;
          dVar5 = dVar1;
        }
        dVar1 = *(double *)((long)pOVar3->m_branch[1].m_rect.m_max + lVar4 + 8);
        if (dVar9 < dVar1) {
          (__return_storage_ptr__->m_max).y = dVar1;
          dVar9 = dVar1;
        }
        dVar1 = *(double *)((long)pOVar3->m_branch[1].m_rect.m_max + lVar4 + 0x10);
        if (dVar10 < dVar1) {
          (__return_storage_ptr__->m_max).z = dVar1;
          dVar10 = dVar1;
        }
        lVar4 = lVar4 + 0x38;
      } while ((long)iVar2 * 0x38 + -0x38 != lVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_BoundingBox ON_RTree::BoundingBox() const
{
  ON_BoundingBox bbox;
  if ( 0 != m_root && m_root->m_count > 0 )
  {
    bbox.m_min = m_root->m_branch[0].m_rect.m_min;
    bbox.m_max = m_root->m_branch[0].m_rect.m_max;
    for ( int i = 1; i < m_root->m_count; i++ )
    {
      if ( m_root->m_branch[i].m_rect.m_min[0] < bbox.m_min.x )
        bbox.m_min.x = m_root->m_branch[i].m_rect.m_min[0];
      if ( m_root->m_branch[i].m_rect.m_min[1] < bbox.m_min.y )
        bbox.m_min.y = m_root->m_branch[i].m_rect.m_min[1];
      if ( m_root->m_branch[i].m_rect.m_min[2] < bbox.m_min.z )
        bbox.m_min.z = m_root->m_branch[i].m_rect.m_min[2];

      if ( m_root->m_branch[i].m_rect.m_max[0] > bbox.m_max.x )
        bbox.m_max.x = m_root->m_branch[i].m_rect.m_max[0];
      if ( m_root->m_branch[i].m_rect.m_max[1] > bbox.m_max.y )
        bbox.m_max.y = m_root->m_branch[i].m_rect.m_max[1];
      if ( m_root->m_branch[i].m_rect.m_max[2] > bbox.m_max.z )
        bbox.m_max.z = m_root->m_branch[i].m_rect.m_max[2];
    }
  }
  return bbox;
}